

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_relaxation.c
# Opt level: O1

int ARKodeGetNumRelaxJacEvals(void *arkode_mem,long *J_evals)

{
  int iVar1;
  ARKodeRelaxMem relax_mem;
  ARKodeMem ark_mem;
  ARKodeRelaxMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkRelaxAccessMem(arkode_mem,"ARKodeGetNumRelaxJacEvals",&local_18,&local_20);
  if (iVar1 == 0) {
    if (local_18->step_supports_relaxation == 0) {
      iVar1 = -0x30;
      arkProcessError(local_18,-0x30,0x2a1,"ARKodeGetNumRelaxJacEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_relaxation.c"
                      ,"time-stepping module does not support relaxation");
    }
    else {
      *J_evals = local_20->num_relax_jac_evals;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKodeGetNumRelaxJacEvals(void* arkode_mem, long int* J_evals)
{
  int retval;
  ARKodeMem ark_mem;
  ARKodeRelaxMem relax_mem;

  retval = arkRelaxAccessMem(arkode_mem, __func__, &ark_mem, &relax_mem);
  if (retval) { return retval; }

  /* Guard against use for time steppers that do not allow relaxation */
  if (!ark_mem->step_supports_relaxation)
  {
    arkProcessError(ark_mem, ARK_STEPPER_UNSUPPORTED, __LINE__, __func__,
                    __FILE__, "time-stepping module does not support relaxation");
    return (ARK_STEPPER_UNSUPPORTED);
  }

  *J_evals = relax_mem->num_relax_jac_evals;

  return ARK_SUCCESS;
}